

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

mz_bool mz_zip_reader_init(mz_zip_archive *pZip,mz_uint64 size,mz_uint32 flags)

{
  mz_bool mVar1;
  mz_bool mVar2;
  
  mVar2 = 0;
  if ((pZip != (mz_zip_archive *)0x0) && (mVar2 = 0, pZip->m_pRead != (mz_file_read_func)0x0)) {
    mVar1 = (anonymous_namespace)::miniz::mz_zip_reader_init_internal(pZip,(mz_uint32)size);
    if (mVar1 != 0) {
      pZip->m_archive_size = size;
      mVar1 = (anonymous_namespace)::miniz::mz_zip_reader_read_central_dir(pZip,flags);
      mVar2 = 1;
      if (mVar1 == 0) {
        mz_zip_reader_end(pZip);
        mVar2 = 0;
      }
    }
  }
  return mVar2;
}

Assistant:

mz_bool mz_zip_reader_init(mz_zip_archive *pZip, mz_uint64 size,
                           mz_uint32 flags) {
  if ((!pZip) || (!pZip->m_pRead))
    return MZ_FALSE;
  if (!mz_zip_reader_init_internal(pZip, flags))
    return MZ_FALSE;
  pZip->m_archive_size = size;
  if (!mz_zip_reader_read_central_dir(pZip, flags)) {
    mz_zip_reader_end(pZip);
    return MZ_FALSE;
  }
  return MZ_TRUE;
}